

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader.cpp
# Opt level: O0

bool __thiscall HttpHeader::addDateField(HttpHeader *this)

{
  bool bVar1;
  char local_98 [8];
  char buf [64];
  undefined1 local_50 [8];
  tm tmp;
  time_t t;
  HttpHeader *this_local;
  
  tmp.tm_zone = (char *)time((time_t *)0x0);
  localtime_r((time_t *)&tmp.tm_zone,(tm *)local_50);
  strftime(local_98,0x40,"%a, %b %e %T %Y",(tm *)local_50);
  bVar1 = HttpHeaderBase::addField(&this->super_HttpHeaderBase,0x3f9,local_98);
  return bVar1;
}

Assistant:

bool HttpHeader::addDateField()
{
	time_t t = time( NULL );
	struct tm tmp;
	localtime_r(&t, &tmp);

	char buf[64];
	strftime(buf, 64, "%a, %b %e %T %Y", &tmp);
	return addField(HttpFieldMap::kFieldDate, buf);
}